

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

UInt32 MatchFinder_GetHashMask(CMatchFinder *p,UInt32 hs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = p->numHashBytes;
  uVar2 = 0xffff;
  if (uVar1 != 2) {
    uVar4 = (ulong)(hs - 1);
    if (hs == 0) {
      uVar4 = 0;
    }
    uVar2 = (uint)(uVar4 >> 1) | (uint)uVar4;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar3 = uVar2 >> 1 | uVar2 >> 9;
    uVar5 = 0xff0000;
    if (uVar1 != 3) {
      uVar5 = uVar3 >> 1;
    }
    if (uVar2 < 0x2000000) {
      uVar5 = uVar3;
    }
    uVar2 = 0xffff;
    if (4 < uVar1) {
      uVar2 = 0x3ffff;
    }
    uVar2 = uVar2 | uVar5;
  }
  return uVar2;
}

Assistant:

static UInt32 MatchFinder_GetHashMask(CMatchFinder *p, UInt32 hs)
{
  if (p->numHashBytes == 2)
    return (1 << 16) - 1;
  if (hs != 0)
    hs--;
  hs |= (hs >> 1);
  hs |= (hs >> 2);
  hs |= (hs >> 4);
  hs |= (hs >> 8);
  // we propagated 16 bits in (hs). Low 16 bits must be set later
  hs >>= 1;
  if (hs >= (1 << 24))
  {
    if (p->numHashBytes == 3)
      hs = (1 << 24) - 1;
    else
      hs >>= 1;
    /* if (bigHash) mode, GetHeads4b() in LzFindMt.c needs (hs >= ((1 << 24) - 1))) */
  }
  // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
  hs |= (1 << 16) - 1; /* don't change it! */
  // bt5: we adjust the size with recommended minimum size
  if (p->numHashBytes >= 5)
    hs |= (256 << kLzHash_CrcShift_2) - 1;
  return hs;
}